

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

bool __thiscall
cmLocalGenerator::AppendLWYUFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  string *__args;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar3;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lwyuOpts;
  allocator<char> local_59;
  string local_58;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"LINK_WHAT_YOU_USE",&local_59);
  bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_58);
  if (bVar1) {
    TVar2 = cmGeneratorTarget::GetType(target);
    if ((TVar2 == EXECUTABLE) ||
       (TVar2 = cmGeneratorTarget::GetType(target), TVar2 == SHARED_LIBRARY)) {
      std::__cxx11::string::~string((string *)&local_58);
    }
    else {
      TVar2 = cmGeneratorTarget::GetType(target);
      std::__cxx11::string::~string((string *)&local_58);
      if (TVar2 != MODULE_LIBRARY) {
        return false;
      }
    }
    this_00 = this->Makefile;
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[24]>
              (&local_58,(char (*) [7])0x72bb95,lang,(char (*) [24])"_LINK_WHAT_YOU_USE_FLAG");
    __args = cmMakefile::GetSafeDefinition(this_00,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    if (__args->_M_string_length != 0) {
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0;
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 &local_58,__args);
      pvVar3 = cmGeneratorTarget::ResolveLinkerWrapper
                         (target,(vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_58,lang,false);
      (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[8])(this,flags,pvVar3);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_58);
      return true;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&local_58);
  }
  return false;
}

Assistant:

bool cmLocalGenerator::AppendLWYUFlags(std::string& flags,
                                       const cmGeneratorTarget* target,
                                       const std::string& lang)
{
  auto useLWYU = target->GetPropertyAsBool("LINK_WHAT_YOU_USE") &&
    (target->GetType() == cmStateEnums::TargetType::EXECUTABLE ||
     target->GetType() == cmStateEnums::TargetType::SHARED_LIBRARY ||
     target->GetType() == cmStateEnums::TargetType::MODULE_LIBRARY);

  if (useLWYU) {
    const auto& lwyuFlag = this->GetMakefile()->GetSafeDefinition(
      cmStrCat("CMAKE_", lang, "_LINK_WHAT_YOU_USE_FLAG"));
    useLWYU = !lwyuFlag.empty();

    if (useLWYU) {
      std::vector<BT<std::string>> lwyuOpts;
      lwyuOpts.emplace_back(lwyuFlag);
      this->AppendFlags(flags, target->ResolveLinkerWrapper(lwyuOpts, lang));
    }
  }

  return useLWYU;
}